

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::MarkRoots
          (Prog *this,SparseArray<int> *rootmap,SparseSet *q,vector<int,_std::allocator<int>_> *stk)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  SparseSet *pSVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  InstOp IVar6;
  reference pvVar7;
  ostream *poVar8;
  int local_1e0 [4];
  LogMessage local_1d0;
  Inst *local_50;
  Inst *ip;
  int id;
  IndexValue *local_38;
  IndexValue *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *stk_local;
  SparseSet *q_local;
  SparseArray<int> *rootmap_local;
  Prog *this_local;
  
  local_28 = stk;
  stk_local = (vector<int,_std::allocator<int>_> *)q;
  q_local = (SparseSet *)rootmap;
  rootmap_local = (SparseArray<int> *)this;
  iVar4 = SparseArray<int>::size(rootmap);
  local_30 = (IndexValue *)SparseArray<int>::set_new(rootmap,0,iVar4);
  pSVar2 = q_local;
  iVar4 = start_unanchored(this);
  bVar3 = SparseArray<int>::has_index((SparseArray<int> *)pSVar2,iVar4);
  pSVar2 = q_local;
  if (!bVar3) {
    iVar4 = start_unanchored(this);
    iVar5 = SparseArray<int>::size((SparseArray<int> *)q_local);
    local_38 = (IndexValue *)SparseArray<int>::set_new((SparseArray<int> *)pSVar2,iVar4,iVar5);
  }
  pSVar2 = q_local;
  iVar4 = start(this);
  bVar3 = SparseArray<int>::has_index((SparseArray<int> *)pSVar2,iVar4);
  pSVar2 = q_local;
  if (!bVar3) {
    iVar4 = start(this);
    iVar5 = SparseArray<int>::size((SparseArray<int> *)q_local);
    _id = SparseArray<int>::set_new((SparseArray<int> *)pSVar2,iVar4,iVar5);
  }
  SparseSet::clear((SparseSet *)stk_local);
  std::vector<int,_std::allocator<int>_>::clear(local_28);
  pvVar1 = local_28;
  ip._4_4_ = start_unanchored(this);
  std::vector<int,_std::allocator<int>_>::push_back(pvVar1,(value_type_conflict *)((long)&ip + 4));
LAB_00175658:
  do {
    bVar3 = std::vector<int,_std::allocator<int>_>::empty(local_28);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::back(local_28);
    ip._0_4_ = *pvVar7;
    std::vector<int,_std::allocator<int>_>::pop_back(local_28);
    while (bVar3 = SparseSet::contains((SparseSet *)stk_local,(value_type)ip), !bVar3) {
      SparseSet::insert_new((SparseSet *)stk_local,(value_type)ip);
      local_50 = inst(this,(value_type)ip);
      IVar6 = Inst::opcode(local_50);
      pSVar2 = q_local;
      pvVar1 = local_28;
      switch(IVar6) {
      case kInstAlt:
      case kInstAltMatch:
        local_1e0[0] = Inst::out1(local_50);
        std::vector<int,_std::allocator<int>_>::push_back(pvVar1,local_1e0);
        ip._0_4_ = Inst::out(local_50);
        break;
      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        iVar4 = Inst::out(local_50);
        bVar3 = SparseArray<int>::has_index((SparseArray<int> *)pSVar2,iVar4);
        pSVar2 = q_local;
        if (!bVar3) {
          iVar4 = Inst::out(local_50);
          iVar5 = SparseArray<int>::size((SparseArray<int> *)q_local);
          SparseArray<int>::set_new((SparseArray<int> *)pSVar2,iVar4,iVar5);
        }
        ip._0_4_ = Inst::out(local_50);
        break;
      case kInstMatch:
      case kInstFail:
        goto LAB_00175658;
      case kInstNop:
        ip._0_4_ = Inst::out(local_50);
        break;
      default:
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_1d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.cc",
                   0x1dd);
        poVar8 = LogMessage::stream(&local_1d0);
        poVar8 = std::operator<<(poVar8,"unhandled opcode: ");
        IVar6 = Inst::opcode(local_50);
        std::ostream::operator<<(poVar8,IVar6);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d0);
        goto LAB_00175658;
      }
    }
  } while( true );
}

Assistant:

void Prog::MarkRoots(SparseArray<int>* rootmap,
                     SparseSet* q, vector<int>* stk) {
  // Mark the kInstFail instruction.
  rootmap->set_new(0, rootmap->size());

  // Mark the start_unanchored and start instructions.
  if (!rootmap->has_index(start_unanchored()))
    rootmap->set_new(start_unanchored(), rootmap->size());
  if (!rootmap->has_index(start()))
    rootmap->set_new(start(), rootmap->size());

  q->clear();
  stk->clear();
  stk->push_back(start_unanchored());
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (q->contains(id))
      continue;
    q->insert_new(id);

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        // Mark the out of this instruction.
        if (!rootmap->has_index(ip->out()))
          rootmap->set_new(ip->out(), rootmap->size());
        id = ip->out();
        goto Loop;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }
}